

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleColsUp2_16_C(uint16_t *dst_ptr,uint16_t *src_ptr,int dst_width,int x,int dx)

{
  uint16_t uVar1;
  long lVar2;
  
  for (lVar2 = 0; (int)lVar2 < dst_width + -1; lVar2 = lVar2 + 2) {
    uVar1 = *(uint16_t *)((long)src_ptr + lVar2);
    dst_ptr[lVar2] = uVar1;
    dst_ptr[lVar2 + 1] = uVar1;
  }
  if ((dst_width & 1U) != 0) {
    dst_ptr[lVar2] = *(uint16_t *)((long)src_ptr + lVar2);
  }
  return;
}

Assistant:

void ScaleColsUp2_16_C(uint16_t* dst_ptr,
                       const uint16_t* src_ptr,
                       int dst_width,
                       int x,
                       int dx) {
  int j;
  (void)x;
  (void)dx;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst_ptr[1] = dst_ptr[0] = src_ptr[0];
    src_ptr += 1;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    dst_ptr[0] = src_ptr[0];
  }
}